

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZEqnArray<long_double>_>::Resize(TPZVec<TPZEqnArray<long_double>_> *this,int64_t newsize)

{
  long lVar1;
  TPZEqnArray<long_double> *pTVar2;
  undefined1 auVar3 [16];
  ostream *this_00;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong in_RSI;
  long in_RDI;
  ulong uVar8;
  int64_t i;
  int64_t large;
  TPZEqnArray<long_double> *newstore;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff18;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff20;
  TPZEqnArray<long_double> *this_01;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff50;
  ulong local_a8;
  long local_90;
  long local_38;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    pvVar4 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      lVar7 = *(long *)(in_RDI + 8);
      if (lVar7 != 0) {
        lVar1 = *(long *)(lVar7 + -8);
        for (lVar5 = lVar7 + lVar1 * 0x51e0; lVar7 != lVar5; lVar5 = lVar5 + -0x51e0) {
          TPZEqnArray<long_double>::~TPZEqnArray(in_stack_ffffffffffffff20);
        }
        operator_delete__((void *)(lVar7 + -0x10),lVar1 * 0x51e0 + 0x10);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_RSI;
      uVar6 = SUB168(auVar3 * ZEXT816(0x51e0),0);
      uVar8 = uVar6 + 0x10;
      if (SUB168(auVar3 * ZEXT816(0x51e0),8) != 0 || 0xffffffffffffffef < uVar6) {
        uVar8 = 0xffffffffffffffff;
      }
      pvVar4 = operator_new__(uVar8);
      *(ulong *)((long)pvVar4 + 8) = in_RSI;
      lVar7 = (long)pvVar4 + 0x10;
      if (in_RSI != 0) {
        local_90 = lVar7;
        do {
          TPZEqnArray<long_double>::TPZEqnArray(in_stack_ffffffffffffff50);
          local_90 = local_90 + 0x51e0;
        } while (local_90 != lVar7 + in_RSI * 0x51e0);
      }
      local_a8 = in_RSI;
      if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
        local_a8 = *(ulong *)(in_RDI + 0x10);
      }
      for (local_38 = 0; local_38 < (long)local_a8; local_38 = local_38 + 1) {
        TPZEqnArray<long_double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      if ((*(long *)(in_RDI + 8) != 0) &&
         (pTVar2 = *(TPZEqnArray<long_double> **)(in_RDI + 8),
         pTVar2 != (TPZEqnArray<long_double> *)0x0)) {
        lVar1 = *(long *)&pTVar2[-1].field_0x51d8;
        this_01 = pTVar2 + lVar1;
        while (pTVar2 != this_01) {
          this_01 = this_01 + -1;
          TPZEqnArray<long_double>::~TPZEqnArray(this_01);
        }
        operator_delete__(&pTVar2[-1].fLastTerm,lVar1 * 0x51e0 + 0x10);
      }
      *(long *)(in_RDI + 8) = lVar7;
      *(ulong *)(in_RDI + 0x10) = in_RSI;
      *(ulong *)(in_RDI + 0x18) = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}